

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

bool __thiscall BasePort::AddBoard(BasePort *this,BoardIO *board)

{
  byte bVar1;
  uint uVar2;
  ostream *this_00;
  void *this_01;
  uint id;
  BoardIO *board_local;
  BasePort *this_local;
  
  bVar1 = board->BoardId;
  uVar2 = (uint)bVar1;
  if (uVar2 < 0x10) {
    this->BoardList[uVar2] = board;
    board->port = this;
    (**board->_vptr_BoardIO)();
    SetReadBufferBroadcast(this);
    SetWriteBufferBroadcast(this);
    if (this->max_board <= uVar2) {
      this->max_board = uVar2 + 1;
    }
    this->BoardInUseMask_ = this->BoardInUseMask_ | 1 << (bVar1 & 0x1f);
    (this->bcReadInfo).boardInfo[uVar2].inUse = true;
    this->NumOfBoards_ = this->NumOfBoards_ + 1;
    uVar2 = GetBroadcastReadSizeQuads(this);
    (this->bcReadInfo).readSizeQuads = uVar2;
    this_local._7_1_ = true;
  }
  else {
    this_00 = std::operator<<(this->outStr,"BasePort::AddBoard: board number out of range: ");
    this_01 = (void *)std::ostream::operator<<(this_00,uVar2);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool BasePort::AddBoard(BoardIO *board)
{
    unsigned int id = board->BoardId;
    if (id >= BoardIO::MAX_BOARDS) {
        outStr << "BasePort::AddBoard: board number out of range: " << id << std::endl;
        return false;
    }
    BoardList[id] = board;
    board->port = this;
    board->InitBoard();

    // Make sure read/write buffers are allocated
    SetReadBufferBroadcast();
    SetWriteBufferBroadcast();

    if (id >= max_board)
        max_board = id+1;
    // update BoardInUseMask_
    BoardInUseMask_ = (BoardInUseMask_ | (1 << id));
    bcReadInfo.boardInfo[id].inUse = true;
    NumOfBoards_++;   // increment board counts

    bcReadInfo.readSizeQuads = GetBroadcastReadSizeQuads();

    return true;
}